

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

void png_handle_oFFs(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  int iVar1;
  uint offset_y;
  uint offset_x;
  char *error_message;
  png_byte buf [9];
  byte local_19;
  byte local_18;
  byte local_17;
  byte local_16;
  byte local_15;
  byte local_14;
  byte local_13;
  byte local_12;
  byte local_11;
  
  if ((png_ptr->mode & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((png_ptr->mode & 4) == 0) {
    if ((info_ptr == (png_inforp)0x0) || ((info_ptr->valid & 0x100) == 0)) {
      if (length == 9) {
        png_crc_read(png_ptr,&local_19,9);
        iVar1 = png_crc_finish(png_ptr,0);
        if (iVar1 == 0) {
          if ((char)local_19 < '\0') {
            offset_x = -((uint)local_18 * 0x7fff0000 -
                         ((uint)local_16 | (uint)local_17 << 8 | (uint)local_19 << 0x18) &
                        0x7fffffff);
          }
          else {
            offset_x = (uint)local_16 |
                       (uint)local_17 << 8 | (uint)local_18 << 0x10 | (uint)local_19 << 0x18;
          }
          if ((char)local_15 < '\0') {
            offset_y = -((uint)local_14 * 0x7fff0000 -
                         ((uint)local_12 | (uint)local_13 << 8 | (uint)local_15 << 0x18) &
                        0x7fffffff);
          }
          else {
            offset_y = (uint)local_12 |
                       (uint)local_13 << 8 | (uint)local_14 << 0x10 | (uint)local_15 << 0x18;
          }
          png_set_oFFs(png_ptr,info_ptr,offset_x,offset_y,(uint)local_11);
        }
        return;
      }
      png_crc_finish(png_ptr,length);
      error_message = "invalid";
    }
    else {
      png_crc_finish(png_ptr,length);
      error_message = "duplicate";
    }
  }
  else {
    png_crc_finish(png_ptr,length);
    error_message = "out of place";
  }
  png_chunk_benign_error(png_ptr,error_message);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_oFFs(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte buf[9];
   png_int_32 offset_x, offset_y;
   int unit_type;

   png_debug(1, "in png_handle_oFFs");

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   else if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of place");
      return;
   }

   else if (info_ptr != NULL && (info_ptr->valid & PNG_INFO_oFFs) != 0)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "duplicate");
      return;
   }

   if (length != 9)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "invalid");
      return;
   }

   png_crc_read(png_ptr, buf, 9);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   offset_x = png_get_int_32(buf);
   offset_y = png_get_int_32(buf + 4);
   unit_type = buf[8];
   png_set_oFFs(png_ptr, info_ptr, offset_x, offset_y, unit_type);
}